

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kgc.cpp
# Opt level: O3

void __thiscall Kgc::markAll(Kgc *this)

{
  pointer pppVVar1;
  pointer ppVVar2;
  pointer pppVVar3;
  pointer ppVVar4;
  
  pppVVar1 = (this->localStackRoots_).
             super__Vector_base<const_Value_**,_std::allocator<const_Value_**>_>._M_impl.
             super__Vector_impl_data._M_finish;
  for (pppVVar3 = (this->localStackRoots_).
                  super__Vector_base<const_Value_**,_std::allocator<const_Value_**>_>._M_impl.
                  super__Vector_impl_data._M_start; pppVVar3 != pppVVar1; pppVVar3 = pppVVar3 + 1) {
    if (**pppVVar3 != (Value *)0x0) {
      mark(this,**pppVVar3);
    }
  }
  ppVVar2 = (this->stackRoots_).super__Vector_base<const_Value_*,_std::allocator<const_Value_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppVVar4 = (this->stackRoots_).
                 super__Vector_base<const_Value_*,_std::allocator<const_Value_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppVVar4 != ppVVar2; ppVVar4 = ppVVar4 + 1) {
    mark(this,*ppVVar4);
  }
  return;
}

Assistant:

void Kgc::markAll()
{
    for (auto v : localStackRoots_)
    {
        if (*v)
        {
            mark(*v);
        }
    }
    
    for (auto v : stackRoots_)
    {
        mark(v);
    }
}